

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hh
# Opt level: O0

process_id_t __thiscall tchecker::system::processes_t::process_id(processes_t *this,string *name)

{
  uint *puVar1;
  string *name_local;
  processes_t *this_local;
  
  puVar1 = index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           ::value(&this->_procs_index,name);
  return *puVar1;
}

Assistant:

inline tchecker::process_id_t process_id(std::string const & name) const
  {
    try {
      return _procs_index.value(name);
    }
    catch (...) {
      throw std::invalid_argument("Unknown process " + name);
    }
  }